

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression *
new_ir_binop(Context_conflict *ctx,MOJOSHADER_irBinOpType op,MOJOSHADER_irExpression *left,
            MOJOSHADER_irExpression *right)

{
  MOJOSHADER_irExpression *pMVar1;
  
  if (right != (MOJOSHADER_irExpression *)0x0 && left != (MOJOSHADER_irExpression *)0x0) {
    pMVar1 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x38,ctx->malloc_data);
    if (pMVar1 != (MOJOSHADER_irExpression *)0x0) {
      (pMVar1->ir).type = MOJOSHADER_IR_BINOP;
      (pMVar1->ir).filename = ctx->sourcefile;
      (pMVar1->ir).line = ctx->sourceline;
      (pMVar1->info).type = (left->info).type;
      (pMVar1->info).elements = (left->info).elements;
      if ((left->info).type != (right->info).type) {
        __assert_fail("left->info.type == right->info.type",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x1201,
                      "MOJOSHADER_irExpression *new_ir_binop(Context *, const MOJOSHADER_irBinOpType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                     );
      }
      if ((left->info).elements == (right->info).elements) {
        (pMVar1->binop).op = op;
        (pMVar1->binop).left = left;
        (pMVar1->binop).right = right;
        return pMVar1;
      }
      __assert_fail("left->info.elements == right->info.elements",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1202,
                    "MOJOSHADER_irExpression *new_ir_binop(Context *, const MOJOSHADER_irBinOpType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                   );
    }
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  return (MOJOSHADER_irExpression *)0x0;
}

Assistant:

static MOJOSHADER_irExpression *new_ir_binop(Context *ctx,
                                       const MOJOSHADER_irBinOpType op,
                                       MOJOSHADER_irExpression *left,
                                       MOJOSHADER_irExpression *right)
{
    if ((!left) || (!right)) return NULL;
    NEW_IR_EXPR(retval, MOJOSHADER_irBinOp, MOJOSHADER_IR_BINOP, left->info.type, left->info.elements);
    assert(left->info.type == right->info.type);
    assert(left->info.elements == right->info.elements);
    retval->op = op;
    retval->left = left;
    retval->right = right;
    return (MOJOSHADER_irExpression *) retval;
}